

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

void __thiscall pktalloc::Allocator::Allocator(Allocator *this)

{
  WindowHeader *pWVar1;
  LightVector<pktalloc::Allocator::WindowHeader_*> *in_RDI;
  WindowHeader *window;
  uint i;
  uint8_t *windowStart;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar2;
  undefined8 in_stack_ffffffffffffffd0;
  WindowHeader *pWVar3;
  
  in_RDI->PreallocatedData[0] = (WindowHeader *)0x0;
  *(undefined4 *)&in_RDI->DataPtr = 0;
  *(undefined8 *)&in_RDI->Allocated = 0;
  *(undefined4 *)in_RDI[1].PreallocatedData = 0x19;
  *(WindowHeader ***)&in_RDI->Allocated = in_RDI->PreallocatedData + 1;
  *(undefined4 *)&in_RDI[1].DataPtr = 0;
  *(undefined8 *)&in_RDI[1].Allocated = 0;
  *(undefined4 *)in_RDI[2].PreallocatedData = 0x19;
  *(WindowHeader ***)&in_RDI[1].Allocated = in_RDI[1].PreallocatedData + 1;
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_NoCopy
            (in_RDI,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  pWVar1 = (WindowHeader *)
           SIMDSafeAllocate(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  in_RDI->PreallocatedData[0] = pWVar1;
  if (in_RDI->PreallocatedData[0] != (WindowHeader *)0x0) {
    pWVar1 = in_RDI->PreallocatedData[0];
    for (uVar2 = 0; uVar2 < 2; uVar2 = uVar2 + 1) {
      pWVar3 = pWVar1 + 0xf2;
      CustomBitSet<2048U>::ClearAll(&pWVar1->Used);
      pWVar1->FreeUnitCount = 0x800;
      pWVar1->ResumeScanOffset = 0;
      pWVar1->Preallocated = true;
      pWVar1->FullListIndex = -1;
      *(WindowHeader **)(*(long *)&in_RDI->Allocated + (long)(int)uVar2 * 8) = pWVar1;
      pWVar1 = pWVar3;
    }
  }
  return;
}

Assistant:

Allocator::Allocator()
{
    static_assert(kAlignmentBytes == kUnitSize, "update SIMDSafeAllocate");

    PreferredWindows.SetSize_NoCopy(kPreallocatedWindows);

    HugeChunkStart = SIMDSafeAllocate(kWindowSizeBytes * kPreallocatedWindows);
    if (HugeChunkStart)
    {
        uint8_t* windowStart = HugeChunkStart;

        // For each window to preallocate:
        for (unsigned i = 0; i < kPreallocatedWindows; ++i)
        {
            WindowHeader* window = (WindowHeader*)windowStart;
            windowStart += kWindowSizeBytes;

            window->Used.ClearAll();
            window->FreeUnitCount = kWindowMaxUnits;
            window->ResumeScanOffset = 0;
            window->Preallocated = true;
            window->FullListIndex = kNotInFullList;

            PreferredWindows.GetRef(i) = window;
        }
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();
}